

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_store_fpr_F(DisasContext_conflict8 *dc,uint dst,TCGv_i32 v)

{
  TCGContext_conflict8 *pTVar1;
  TCGv_i64 ret;
  TCGv_i32 ret_00;
  uint arg2;
  
  pTVar1 = dc->uc->tcg_ctx;
  ret = pTVar1->cpu_fpr[dst >> 1];
  tcg_gen_deposit_i64_sparc64(pTVar1,ret,ret,(TCGv_i64)v,(~dst & 1) << 5,0x20);
  arg2 = (0x1f < (int)dst) + 1;
  if ((dc->fprs_dirty & arg2) != 0) {
    return;
  }
  pTVar1 = dc->uc->tcg_ctx;
  dc->fprs_dirty = dc->fprs_dirty | arg2;
  ret_00 = pTVar1->cpu_fprs;
  tcg_gen_ori_i32_sparc64(pTVar1,ret_00,ret_00,arg2);
  return;
}

Assistant:

static void gen_store_fpr_F(DisasContext *dc, unsigned int dst, TCGv_i32 v)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
#if TCG_TARGET_REG_BITS == 32
    if (dst & 1) {
        tcg_gen_mov_i32(tcg_ctx, TCGV_LOW(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2]), v);
    } else {
        tcg_gen_mov_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2]), v);
    }
#else
    TCGv_i64 t = (TCGv_i64)v;
    tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2], tcg_ctx->cpu_fpr[dst / 2], t,
                        (dst & 1 ? 0 : 32), 32);
#endif
    gen_update_fprs_dirty(dc, dst);
}